

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_iso9660.c
# Opt level: O1

void isoent_setup_directory_location(iso9660_conflict *iso9660,int location,vdd *vdd)

{
  isoent **ppiVar1;
  isofile *piVar2;
  content_conflict *pcVar3;
  extr_rec *peVar4;
  int iVar5;
  int iVar6;
  isoent *isoent;
  isoent *piVar7;
  int iVar8;
  long lVar9;
  isoent *piVar10;
  int iVar11;
  int iVar12;
  isofile *piVar13;
  bool bVar14;
  
  vdd->total_dir_block = 0;
  iVar8 = 0;
  isoent = vdd->rootent;
  do {
    iVar12 = 1;
    iVar5 = set_directory_record
                      ((uchar *)0x0,0xffffffffffffffff,isoent,iso9660,DIR_REC_SELF,vdd->vdd_type);
    iVar6 = set_directory_record
                      ((uchar *)0x0,0xffffffffffffffff,isoent,iso9660,DIR_REC_PARENT,vdd->vdd_type);
    if ((0 < (isoent->children).cnt) &&
       (((vdd->vdd_type == VDD_JOLIET || ((*(ushort *)&(iso9660->opt).field_0x2 & 0x180) != 0)) ||
        (iVar8 + 1 < vdd->max_depth)))) {
      iVar6 = iVar6 + iVar5;
      ppiVar1 = isoent->children_sorted;
      iVar12 = 1;
      lVar9 = 0;
      do {
        piVar7 = ppiVar1[lVar9];
        piVar2 = piVar7->file;
        piVar13 = piVar2->hardlink_target;
        if (piVar13 == (isofile *)0x0) {
          piVar13 = piVar2;
        }
        piVar13->cur_content = &piVar13->content;
        do {
          iVar5 = set_directory_record
                            ((uchar *)0x0,0xffffffffffffffff,piVar7,iso9660,DIR_REC_NORMAL,
                             vdd->vdd_type);
          iVar11 = iVar6 + iVar5;
          iVar6 = iVar11;
          if (0x800 < iVar11) {
            iVar6 = iVar5;
          }
          iVar12 = iVar12 + (uint)(0x800 < iVar11);
          pcVar3 = piVar13->cur_content->next;
          piVar13->cur_content = pcVar3;
        } while (pcVar3 != (content_conflict *)0x0);
        lVar9 = lVar9 + 1;
      } while (lVar9 < (isoent->children).cnt);
    }
    isoent->dir_block = iVar12;
    iVar5 = vdd->total_dir_block + iVar12;
    vdd->total_dir_block = iVar5;
    isoent->dir_location = location;
    peVar4 = (isoent->extr_rec_list).first;
    (isoent->extr_rec_list).current = peVar4;
    iVar6 = 0;
    for (; peVar4 != (extr_rec *)0x0; peVar4 = peVar4->next) {
      iVar11 = iVar12 + location + iVar6;
      iVar6 = iVar6 + 1;
      peVar4->location = iVar11;
      peVar4->offset = 0;
    }
    vdd->total_dir_block = iVar5 + iVar6;
    piVar7 = (isoent->subdirs).first;
    if (((piVar7 == (isoent *)0x0) || (iVar5 = iVar8 + 1, vdd->max_depth <= iVar8 + 1)) &&
       (piVar10 = isoent->parent, piVar7 = isoent, iVar5 = iVar8, isoent != piVar10)) {
      do {
        piVar7 = isoent->drnext;
        iVar5 = iVar8;
        if (isoent->drnext != (isoent *)0x0) break;
        iVar8 = iVar8 + -1;
        bVar14 = piVar10 != piVar10->parent;
        piVar7 = piVar10;
        isoent = piVar10;
        piVar10 = piVar10->parent;
        iVar5 = iVar8;
      } while (bVar14);
    }
    iVar8 = iVar5;
    location = iVar6 + iVar12 + location;
    isoent = piVar7;
    if (piVar7 == piVar7->parent) {
      return;
    }
  } while( true );
}

Assistant:

static void
isoent_setup_directory_location(struct iso9660 *iso9660, int location,
    struct vdd *vdd)
{
	struct isoent *np;
	int depth;

	vdd->total_dir_block = 0;
	depth = 0;
	np = vdd->rootent;
	do {
		int block;

		np->dir_block = calculate_directory_descriptors(
		    iso9660, vdd, np, depth);
		vdd->total_dir_block += np->dir_block;
		np->dir_location = location;
		location += np->dir_block;
		block = extra_setup_location(np, location);
		vdd->total_dir_block += block;
		location += block;

		if (np->subdirs.first != NULL && depth + 1 < vdd->max_depth) {
			/* Enter to sub directories. */
			np = np->subdirs.first;
			depth++;
			continue;
		}
		while (np != np->parent) {
			if (np->drnext == NULL) {
				/* Return to the parent directory. */
				np = np->parent;
				depth--;
			} else {
				np = np->drnext;
				break;
			}
		}
	} while (np != np->parent);
}